

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O2

h2o_hostconf_t *
find_hostconf(h2o_hostconf_t **hostconfs,h2o_iovec_t authority,uint16_t default_port)

{
  char cVar1;
  size_t target_len;
  long lVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  char cVar8;
  char *__dest;
  h2o_hostconf_t *phVar9;
  h2o_hostconf_t **pphVar10;
  undefined8 uStack_60;
  char acStack_58 [8];
  undefined1 local_50 [8];
  h2o_iovec_t hostname;
  uint16_t local_32 [4];
  uint16_t port;
  
  if (authority.len < 0x10000) {
    uStack_60 = 0x13af1e;
    pcVar6 = h2o_url_parse_hostport(authority.base,authority.len,(h2o_iovec_t *)local_50,local_32);
    if (pcVar6 != (char *)0x0) {
      if (local_32[0] == 0xffff) {
        local_32[0] = default_port;
      }
      uVar4 = local_32[0];
      lVar2 = -((ulong)(hostname.base + 0xf) & 0xfffffffffffffff0);
      __dest = acStack_58 + lVar2;
      *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13af5c;
      memcpy(__dest,(void *)local_50,(size_t)hostname.base);
      for (pcVar6 = (char *)0x0; hostname.base != pcVar6; pcVar6 = pcVar6 + 1) {
        cVar1 = __dest[(long)pcVar6];
        cVar8 = cVar1 + ' ';
        if (0x19 < (int)cVar1 - 0x41U) {
          cVar8 = cVar1;
        }
        __dest[(long)pcVar6] = cVar8;
      }
      hostname.len = (size_t)(__dest + (long)hostname.base);
      phVar9 = *hostconfs;
      pphVar10 = hostconfs + 1;
      do {
        uVar3 = (uint16_t)*(undefined4 *)&(phVar9->authority).port;
        if ((uVar3 == uVar4) || (uVar3 == 0xffff && default_port == uVar4)) {
          pcVar6 = (phVar9->authority).host.base;
          target_len = (phVar9->authority).host.len;
          if (*pcVar6 == '*') {
            if ((char *)(target_len - 1) < hostname.base) {
              lVar7 = hostname.len - target_len;
              *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13afdd;
              iVar5 = bcmp(pcVar6 + 1,(void *)(lVar7 + 1),(size_t)(target_len - 1));
              if (iVar5 == 0) {
                return phVar9;
              }
            }
          }
          else {
            *(undefined8 *)((long)&uStack_60 + lVar2) = 0x13aff2;
            iVar5 = h2o_memis(pcVar6,target_len,__dest,(size_t)hostname.base);
            if (iVar5 != 0) {
              return phVar9;
            }
          }
        }
        phVar9 = *pphVar10;
        pphVar10 = pphVar10 + 1;
      } while (phVar9 != (h2o_hostconf_t *)0x0);
    }
  }
  return (h2o_hostconf_t *)0x0;
}

Assistant:

static h2o_hostconf_t *find_hostconf(h2o_hostconf_t **hostconfs, h2o_iovec_t authority, uint16_t default_port)
{
    h2o_iovec_t hostname;
    uint16_t port;
    char *hostname_lc;

    /* safe-guard for alloca */
    if (authority.len >= 65536)
        return NULL;

    /* extract the specified hostname and port */
    if (h2o_url_parse_hostport(authority.base, authority.len, &hostname, &port) == NULL)
        return NULL;
    if (port == 65535)
        port = default_port;

    /* convert supplied hostname to lower-case */
    hostname_lc = alloca(hostname.len);
    memcpy(hostname_lc, hostname.base, hostname.len);
    h2o_strtolower(hostname_lc, hostname.len);

    do {
        h2o_hostconf_t *hostconf = *hostconfs;
        if (hostconf->authority.port == port || (hostconf->authority.port == 65535 && port == default_port)) {
            if (hostconf->authority.host.base[0] == '*') {
                /* matching against "*.foo.bar" */
                size_t cmplen = hostconf->authority.host.len - 1;
                if (cmplen < hostname.len &&
                    memcmp(hostconf->authority.host.base + 1, hostname_lc + hostname.len - cmplen, cmplen) == 0)
                    return hostconf;
            } else {
                /* exact match */
                if (h2o_memis(hostconf->authority.host.base, hostconf->authority.host.len, hostname_lc, hostname.len))
                    return hostconf;
            }
        }
    } while (*++hostconfs != NULL);

    return NULL;
}